

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QFixed __thiscall
QTextDocumentLayoutPrivate::scaleToDevice(QTextDocumentLayoutPrivate *this,QFixed value)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QFixed o;
  QFixed local_1c;
  QFixed local_18;
  int local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  if (*(long *)(in_RDI + 0x80) != 0) {
    iVar1 = QPaintDevice::logicalDpiY((QPaintDevice *)0x809b7e);
    o.val = (int)in_RDI;
    QFixed::QFixed(&local_18,iVar1);
    local_14 = (int)QFixed::operator*((QFixed *)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                      o);
    iVar1 = qt_defaultDpi();
    QFixed::QFixed(&local_1c,iVar1);
    local_c = (int)QFixed::operator/((QFixed *)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),o
                                    );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFixed)local_c;
}

Assistant:

QFixed QTextDocumentLayoutPrivate::scaleToDevice(QFixed value) const
{
    if (!paintDevice)
        return value;
    return value * QFixed(paintDevice->logicalDpiY()) / QFixed(qt_defaultDpi());
}